

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nlsol_ex_mdl.h
# Opt level: O0

void __thiscall
ExampleModel::
WriteConExpr<mp::NLWriter2<mp::NLWriter2Params<mp::TextFormatter,ExampleNLFeeder>>::ExprArgWriter>
          (ExampleModel *this,int i,ExprArgWriter *ew)

{
  Opcode oc;
  Opcode oc_00;
  Opcode oc_01;
  Opcode oc_02;
  Opcode oc_03;
  Opcode oc_04;
  Opcode oc_05;
  Opcode oc_06;
  Opcode oc_07;
  int in_ESI;
  ExprArgWriter ew01020201;
  ExprArgWriter ew010202;
  ExprArgWriter ew01020101;
  ExprArgWriter ew010201;
  ExprArgWriter ew0102;
  ExprArgWriter ew010101;
  ExprArgWriter ew0101_1;
  ExprArgWriter ew01_1;
  ExprArgWriter ew0101;
  ExprArgWriter ew01;
  ExprArgWriter *in_stack_fffffffffffffe88;
  ExprArgWriter *in_stack_fffffffffffffe90;
  ExprArgWriter *pEVar1;
  undefined4 in_stack_fffffffffffffe98;
  int in_stack_fffffffffffffe9c;
  undefined4 in_stack_fffffffffffffea0;
  ExprArgWriter *in_stack_fffffffffffffea8;
  ExprArgWriter local_148;
  ExprArgWriter local_138;
  undefined8 local_128;
  undefined8 uStack_120;
  ExprArgWriter local_118;
  undefined8 local_108;
  undefined8 uStack_100;
  ExprArgWriter local_f8;
  undefined8 local_e8;
  undefined8 uStack_e0;
  ExprArgWriter local_d8;
  undefined8 local_c8;
  undefined8 uStack_c0;
  ExprArgWriter local_b8;
  undefined8 local_a8;
  undefined8 uStack_a0;
  ExprArgWriter local_98;
  undefined8 local_88;
  undefined8 uStack_80;
  ExprArgWriter local_78;
  undefined8 local_68;
  undefined8 uStack_60;
  ExprArgWriter local_58 [2];
  undefined8 local_38;
  undefined8 uStack_30;
  ExprArgWriter local_28 [2];
  
  if (in_ESI == 0) {
    local_38 = 2;
    uStack_30 = 0x141627;
    pEVar1 = local_28;
    oc.name._0_4_ = (int)pEVar1;
    oc._0_8_ = in_stack_fffffffffffffe90;
    oc.name._4_4_ = (int)((ulong)pEVar1 >> 0x20);
    mp::NLWriter2<mp::NLWriter2Params<mp::TextFormatter,_ExampleNLFeeder>_>::ExprArgWriter::
    OPut2<mp::nl::Opcode>(in_stack_fffffffffffffe88,oc);
    mp::NLWriter2<mp::NLWriter2Params<mp::TextFormatter,_ExampleNLFeeder>_>::ExprArgWriter::NPut
              (in_stack_fffffffffffffe90,(double)in_stack_fffffffffffffe88);
    local_68 = 5;
    uStack_60 = 0x14160e;
    oc_00.name._0_4_ = (int)pEVar1;
    oc_00._0_8_ = in_stack_fffffffffffffe90;
    oc_00.name._4_4_ = (int)((ulong)pEVar1 >> 0x20);
    mp::NLWriter2<mp::NLWriter2Params<mp::TextFormatter,_ExampleNLFeeder>_>::ExprArgWriter::
    OPut2<mp::nl::Opcode>(in_stack_fffffffffffffe88,oc_00);
    mp::NLWriter2<mp::NLWriter2Params<mp::TextFormatter,_ExampleNLFeeder>_>::ExprArgWriter::VPut
              ((ExprArgWriter *)CONCAT44(in_ESI,in_stack_fffffffffffffea0),
               (int)((ulong)pEVar1 >> 0x20),(char *)in_stack_fffffffffffffe90);
    mp::NLWriter2<mp::NLWriter2Params<mp::TextFormatter,_ExampleNLFeeder>_>::ExprArgWriter::NPut
              (in_stack_fffffffffffffe90,(double)in_stack_fffffffffffffe88);
    mp::NLWriter2<mp::NLWriter2Params<mp::TextFormatter,_ExampleNLFeeder>_>::ExprArgWriter::
    ~ExprArgWriter(local_58);
    mp::NLWriter2<mp::NLWriter2Params<mp::TextFormatter,_ExampleNLFeeder>_>::ExprArgWriter::
    ~ExprArgWriter(local_28);
  }
  else if (in_ESI == 1) {
    local_88 = 0;
    uStack_80 = 0x1415f6;
    pEVar1 = &local_78;
    oc_01.name._0_4_ = in_stack_fffffffffffffe98;
    oc_01._0_8_ = pEVar1;
    oc_01.name._4_4_ = in_stack_fffffffffffffe9c;
    mp::NLWriter2<mp::NLWriter2Params<mp::TextFormatter,_ExampleNLFeeder>_>::ExprArgWriter::
    OPut2<mp::nl::Opcode>(in_stack_fffffffffffffe88,oc_01);
    local_a8 = 2;
    uStack_a0 = 0x141627;
    oc_02.name._0_4_ = in_stack_fffffffffffffe98;
    oc_02._0_8_ = pEVar1;
    oc_02.name._4_4_ = in_stack_fffffffffffffe9c;
    mp::NLWriter2<mp::NLWriter2Params<mp::TextFormatter,_ExampleNLFeeder>_>::ExprArgWriter::
    OPut2<mp::nl::Opcode>(in_stack_fffffffffffffe88,oc_02);
    mp::NLWriter2<mp::NLWriter2Params<mp::TextFormatter,_ExampleNLFeeder>_>::ExprArgWriter::NPut
              (pEVar1,(double)in_stack_fffffffffffffe88);
    local_c8 = 5;
    uStack_c0 = 0x14160e;
    oc_03.name._0_4_ = in_stack_fffffffffffffe98;
    oc_03._0_8_ = pEVar1;
    oc_03.name._4_4_ = in_stack_fffffffffffffe9c;
    mp::NLWriter2<mp::NLWriter2Params<mp::TextFormatter,_ExampleNLFeeder>_>::ExprArgWriter::
    OPut2<mp::nl::Opcode>(in_stack_fffffffffffffe88,oc_03);
    mp::NLWriter2<mp::NLWriter2Params<mp::TextFormatter,_ExampleNLFeeder>_>::ExprArgWriter::VPut
              ((ExprArgWriter *)CONCAT44(in_ESI,in_stack_fffffffffffffea0),in_stack_fffffffffffffe9c
               ,(char *)pEVar1);
    mp::NLWriter2<mp::NLWriter2Params<mp::TextFormatter,_ExampleNLFeeder>_>::ExprArgWriter::NPut
              (pEVar1,(double)in_stack_fffffffffffffe88);
    mp::NLWriter2<mp::NLWriter2Params<mp::TextFormatter,_ExampleNLFeeder>_>::ExprArgWriter::
    ~ExprArgWriter(&local_b8);
    mp::NLWriter2<mp::NLWriter2Params<mp::TextFormatter,_ExampleNLFeeder>_>::ExprArgWriter::
    ~ExprArgWriter(&local_98);
    local_e8 = 2;
    uStack_e0 = 0x141627;
    oc_04.name._0_4_ = in_stack_fffffffffffffe98;
    oc_04._0_8_ = pEVar1;
    oc_04.name._4_4_ = in_stack_fffffffffffffe9c;
    mp::NLWriter2<mp::NLWriter2Params<mp::TextFormatter,_ExampleNLFeeder>_>::ExprArgWriter::
    OPut2<mp::nl::Opcode>(in_stack_fffffffffffffe88,oc_04);
    local_108 = 2;
    uStack_100 = 0x141627;
    oc_05.name._0_4_ = in_stack_fffffffffffffe98;
    oc_05._0_8_ = pEVar1;
    oc_05.name._4_4_ = in_stack_fffffffffffffe9c;
    mp::NLWriter2<mp::NLWriter2Params<mp::TextFormatter,_ExampleNLFeeder>_>::ExprArgWriter::
    OPut2<mp::nl::Opcode>(in_stack_fffffffffffffe88,oc_05);
    mp::NLWriter2<mp::NLWriter2Params<mp::TextFormatter,_ExampleNLFeeder>_>::ExprArgWriter::NPut
              (pEVar1,(double)in_stack_fffffffffffffe88);
    local_128 = 0x29;
    uStack_120 = 0x141629;
    oc_06.name._0_4_ = in_stack_fffffffffffffe98;
    oc_06._0_8_ = pEVar1;
    oc_06.name._4_4_ = in_stack_fffffffffffffe9c;
    mp::NLWriter2<mp::NLWriter2Params<mp::TextFormatter,_ExampleNLFeeder>_>::ExprArgWriter::
    OPut1<mp::nl::Opcode>(in_stack_fffffffffffffe88,oc_06);
    mp::NLWriter2<mp::NLWriter2Params<mp::TextFormatter,_ExampleNLFeeder>_>::ExprArgWriter::VPut
              ((ExprArgWriter *)CONCAT44(in_ESI,in_stack_fffffffffffffea0),in_stack_fffffffffffffe9c
               ,(char *)pEVar1);
    mp::NLWriter2<mp::NLWriter2Params<mp::TextFormatter,_ExampleNLFeeder>_>::ExprArgWriter::
    ~ExprArgWriter(&local_118);
    mp::NLWriter2<mp::NLWriter2Params<mp::TextFormatter,_ExampleNLFeeder>_>::ExprArgWriter::
    ~ExprArgWriter(&local_f8);
    mp::NLWriter2<mp::NLWriter2Params<mp::TextFormatter,_ExampleNLFeeder>_>::ExprArgWriter::OPut2
              (in_stack_fffffffffffffea8,in_ESI,
               (char *)CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98));
    mp::NLWriter2<mp::NLWriter2Params<mp::TextFormatter,_ExampleNLFeeder>_>::ExprArgWriter::VPut
              ((ExprArgWriter *)CONCAT44(in_ESI,in_stack_fffffffffffffea0),in_stack_fffffffffffffe9c
               ,(char *)pEVar1);
    oc_07.name._0_4_ = in_stack_fffffffffffffe98;
    oc_07._0_8_ = pEVar1;
    oc_07.name._4_4_ = in_stack_fffffffffffffe9c;
    mp::NLWriter2<mp::NLWriter2Params<mp::TextFormatter,_ExampleNLFeeder>_>::ExprArgWriter::
    OPut2<mp::nl::Opcode>(in_stack_fffffffffffffe88,oc_07);
    mp::NLWriter2<mp::NLWriter2Params<mp::TextFormatter,_ExampleNLFeeder>_>::ExprArgWriter::VPut
              ((ExprArgWriter *)CONCAT44(in_ESI,in_stack_fffffffffffffea0),in_stack_fffffffffffffe9c
               ,(char *)pEVar1);
    mp::NLWriter2<mp::NLWriter2Params<mp::TextFormatter,_ExampleNLFeeder>_>::ExprArgWriter::NPut
              (pEVar1,(double)in_stack_fffffffffffffe88);
    mp::NLWriter2<mp::NLWriter2Params<mp::TextFormatter,_ExampleNLFeeder>_>::ExprArgWriter::
    ~ExprArgWriter(&local_148);
    mp::NLWriter2<mp::NLWriter2Params<mp::TextFormatter,_ExampleNLFeeder>_>::ExprArgWriter::
    ~ExprArgWriter(&local_138);
    mp::NLWriter2<mp::NLWriter2Params<mp::TextFormatter,_ExampleNLFeeder>_>::ExprArgWriter::
    ~ExprArgWriter(&local_d8);
    mp::NLWriter2<mp::NLWriter2Params<mp::TextFormatter,_ExampleNLFeeder>_>::ExprArgWriter::
    ~ExprArgWriter(&local_78);
  }
  else if (in_ESI == 2) {
    mp::NLWriter2<mp::NLWriter2Params<mp::TextFormatter,_ExampleNLFeeder>_>::ExprArgWriter::NPut
              (in_stack_fffffffffffffe90,(double)in_stack_fffffffffffffe88);
  }
  return;
}

Assistant:

void WriteConExpr(int i, EWriter& ew) const {
    using namespace mp::nl;
    switch (i) {
    case 0:                  // C1_t2
    {
      auto ew01 = ew.OPut2(MUL);
      ew01.NPut(5);
      {
        auto ew0101 = ew01.OPut2(POW);
        ew0101.VPut(3, "t2");
        ew0101.NPut(2);
      }
    } break;
    case 1:                  // C2_t1t2t3
    {
      auto ew01 = ew.OPut2(ADD);
      {
        auto ew0101 = ew01.OPut2(MUL);
        ew0101.NPut(-38.2);
        {
          auto ew010101 = ew0101.OPut2(POW);
          ew010101.VPut(0, "y");
          ew010101.NPut(2);
        }
      }
      {
        auto ew0102 = ew01.OPut2(MUL);
        {
          auto ew010201 = ew0102.OPut2(MUL);
          ew010201.NPut(109);
          {
            auto ew01020101 = ew010201.OPut1(SIN);
            ew01020101.VPut(3, "t2");
          }
        }
        {
          auto ew010202 = ew0102.OPut2(ADD.code, ADD.name);
          ew010202.VPut(5, "t1");
          {
            auto ew01020201 = ew010202.OPut2(POW);
            ew01020201.VPut(4, "t3");
            ew01020201.NPut(1.5);
          }
        }
      }
    } break;
    case 2:                  // C0_lin
      ew.NPut(0);            // no non-linear part
      break;
    default:
      assert(false);
    {}
    }
  }